

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int __thiscall Pathie::Path::fnmatch(Path *this,char *__pattern,char *__name,int __flags)

{
  int iVar1;
  string pattern_nstr;
  string nstr;
  string local_50;
  string local_30;
  
  utf8_to_filename(&local_30,&this->m_path);
  utf8_to_filename(&local_50,(string *)__pattern);
  iVar1 = ::fnmatch(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p,(int)__name);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool Path::fnmatch(const std::string& pattern, int flags /* = 0 */) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  std::string pattern_nstr = utf8_to_filename(pattern);
  return ::fnmatch(pattern_nstr.c_str(), nstr.c_str(), flags) == 0;
#elif defined(_WIN32)
  std::wstring utf16path = utf8_to_utf16(m_path);
  std::wstring utf16pattern = utf8_to_utf16(pattern);
  return PathMatchSpecW(utf16path.c_str(), utf16pattern.c_str());
#else
#error Unsupported system.
#endif
}